

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableLoadSettings(ImGuiTable *table)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  ImGuiTableSettings *p;
  byte *pbVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  ImGuiTableColumn *pIVar7;
  long lVar8;
  char *pcVar9;
  byte bVar10;
  bool bVar11;
  int iVar12;
  
  pIVar2 = GImGui;
  table->IsSettingsRequestLoad = false;
  if ((table->Flags & 0x10) == 0) {
    if (table->SettingsOffset == -1) {
      p = TableSettingsFindByID(table->ID);
      if (p == (ImGuiTableSettings *)0x0) {
        return;
      }
      if (table->ColumnsCount != (int)p->ColumnsCount) {
        table->IsSettingsDirty = true;
      }
      iVar5 = ImChunkStream<ImGuiTableSettings>::offset_from_ptr(&pIVar2->SettingsTables,p);
      table->SettingsOffset = iVar5;
    }
    else {
      p = TableGetBoundSettings(table);
    }
    table->SettingsLoadedFlags = p->SaveFlags;
    table->RefScale = p->RefScale;
    if ('\0' < p->ColumnsCount) {
      pbVar3 = (byte *)((long)&p[1].RefScale + 3);
      iVar5 = 0;
      do {
        bVar10 = pbVar3[-3];
        iVar12 = (int)(char)bVar10;
        if ((-1 < iVar12) && (iVar12 < table->ColumnsCount)) {
          pIVar7 = (table->Columns).Data + iVar12;
          if ((table->Columns).DataEnd <= pIVar7) goto LAB_001afcb6;
          uVar1 = p->SaveFlags;
          if ((uVar1 & 1) != 0) {
            (&pIVar7->StretchWeight)[(ulong)((*pbVar3 & 8) == 0) * 2] = *(float *)(pbVar3 + -0xb);
            pIVar7->AutoFitQueue = '\0';
          }
          if ((uVar1 & 2) != 0) {
            bVar10 = pbVar3[-2];
          }
          pIVar7->DisplayOrder = bVar10;
          bVar11 = (bool)(*pbVar3 >> 2 & 1);
          pIVar7->IsEnabledNextFrame = bVar11;
          pIVar7->IsEnabled = bVar11;
          pIVar7->SortOrder = pbVar3[-1];
          pIVar7->field_0x64 = pIVar7->field_0x64 & 0xfc | *pbVar3 & 3;
        }
        iVar5 = iVar5 + 1;
        pbVar3 = pbVar3 + 0xc;
      } while (iVar5 < p->ColumnsCount);
    }
    if (0 < table->ColumnsCount) {
      lVar4 = 0;
      lVar6 = 0;
      do {
        pIVar7 = (table->Columns).Data;
        if ((table->Columns).DataEnd <=
            (ImGuiTableColumn *)((long)&(pIVar7->ClipRect).Min.x + lVar4)) {
LAB_001afcb6:
          pcVar9 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
LAB_001afce2:
          __assert_fail("p >= Data && p < DataEnd",
                        "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_internal.h"
                        ,0x20b,pcVar9);
        }
        lVar8 = (long)(&pIVar7->DisplayOrder)[lVar4];
        if ((lVar8 < 0) ||
           (pcVar9 = (table->DisplayOrderToIndex).Data + lVar8,
           (table->DisplayOrderToIndex).DataEnd <= pcVar9)) {
          pcVar9 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
          goto LAB_001afce2;
        }
        *pcVar9 = (char)lVar6;
        lVar6 = lVar6 + 1;
        lVar4 = lVar4 + 0x68;
      } while (lVar6 < table->ColumnsCount);
    }
  }
  return;
}

Assistant:

void ImGui::TableLoadSettings(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    table->IsSettingsRequestLoad = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind settings
    ImGuiTableSettings* settings;
    if (table->SettingsOffset == -1)
    {
        settings = TableSettingsFindByID(table->ID);
        if (settings == NULL)
            return;
        if (settings->ColumnsCount != table->ColumnsCount) // Allow settings if columns count changed. We could otherwise decide to return...
            table->IsSettingsDirty = true;
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    else
    {
        settings = TableGetBoundSettings(table);
    }

    table->SettingsLoadedFlags = settings->SaveFlags;
    table->RefScale = settings->RefScale;

    // Serialize ImGuiTableSettings/ImGuiTableColumnSettings into ImGuiTable/ImGuiTableColumn
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();
    for (int data_n = 0; data_n < settings->ColumnsCount; data_n++, column_settings++)
    {
        int column_n = column_settings->Index;
        if (column_n < 0 || column_n >= table->ColumnsCount)
            continue;

        ImGuiTableColumn* column = &table->Columns[column_n];
        if (settings->SaveFlags & ImGuiTableFlags_Resizable)
        {
            if (column_settings->IsStretch)
                column->StretchWeight = column_settings->WidthOrWeight;
            else
                column->WidthRequest = column_settings->WidthOrWeight;
            column->AutoFitQueue = 0x00;
        }
        if (settings->SaveFlags & ImGuiTableFlags_Reorderable)
            column->DisplayOrder = column_settings->DisplayOrder;
        else
            column->DisplayOrder = (ImGuiTableColumnIdx)column_n;
        column->IsEnabled = column->IsEnabledNextFrame = column_settings->IsEnabled;
        column->SortOrder = column_settings->SortOrder;
        column->SortDirection = column_settings->SortDirection;
    }

    // FIXME-TABLE: Need to validate .ini data
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        table->DisplayOrderToIndex[table->Columns[column_n].DisplayOrder] = (ImGuiTableColumnIdx)column_n;
}